

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_help.c
# Opt level: O0

void inithelpscan(scan_ctx *ctx,char *trigger,char *arg,char *endarg)

{
  size_t sVar1;
  char *endarg_local;
  char *arg_local;
  char *trigger_local;
  scan_ctx *ctx_local;
  
  ctx->trigger = trigger;
  sVar1 = strlen(trigger);
  ctx->tlen = sVar1;
  ctx->arg = arg;
  sVar1 = strlen(arg);
  ctx->flen = sVar1;
  ctx->endarg = endarg;
  sVar1 = strlen(endarg);
  ctx->elen = sVar1;
  ctx->show = '\0';
  ctx->olen = 0;
  memset(ctx->rbuf,0,0x28);
  return;
}

Assistant:

void inithelpscan(struct scan_ctx *ctx,
                  const char *trigger,
                  const char *arg,
                  const char *endarg)
{
  ctx->trigger = trigger;
  ctx->tlen = strlen(trigger);
  ctx->arg = arg;
  ctx->flen = strlen(arg);
  ctx->endarg = endarg;
  ctx->elen = strlen(endarg);
  DEBUGASSERT((ctx->elen < sizeof(ctx->rbuf)) ||
              (ctx->flen < sizeof(ctx->rbuf)));
  ctx->show = 0;
  ctx->olen = 0;
  memset(ctx->rbuf, 0, sizeof(ctx->rbuf));
}